

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3Fts3MsrIncrNext
              (Fts3Table *p,Fts3MultiSegReader *pMsr,sqlite3_int64 *piDocid,char **paPoslist,
              int *pnPoslist)

{
  int nSegment;
  Fts3SegReader **ppFVar1;
  char *pcVar2;
  long lVar3;
  Fts3SegReader *pReader;
  int iVar4;
  int iVar5;
  long lVar6;
  int nList;
  char *pList;
  int local_5c;
  char *local_58;
  char **local_50;
  long *local_48;
  int *local_40;
  _func_int_Fts3SegReader_ptr_Fts3SegReader_ptr *local_38;
  
  nSegment = pMsr->nAdvance;
  local_38 = fts3SegReaderDoclistCmpRev;
  if (p->bDescIdx == '\0') {
    local_38 = fts3SegReaderDoclistCmp;
  }
  if ((long)nSegment == 0) {
    *paPoslist = (char *)0x0;
  }
  else {
    ppFVar1 = pMsr->apSegment;
    pcVar2 = (*ppFVar1)->pOffsetList;
    local_48 = piDocid;
    local_50 = paPoslist;
    local_40 = pnPoslist;
    while (pcVar2 != (char *)0x0) {
      lVar3 = (*ppFVar1)->iDocid;
      iVar4 = fts3SegReaderNextDocid(p,*ppFVar1,&local_58,&local_5c);
      if (iVar4 == 0 && 1 < nSegment) {
        lVar6 = 1;
        do {
          pReader = ppFVar1[lVar6];
          if ((pReader->pOffsetList == (char *)0x0) || (pReader->iDocid != lVar3))
          goto LAB_001c0698;
          iVar4 = fts3SegReaderNextDocid(p,pReader,(char **)0x0,(int *)0x0);
          lVar6 = lVar6 + 1;
        } while ((iVar4 == 0) && (lVar6 < nSegment));
      }
      else {
        lVar6 = 1;
      }
      if (iVar4 != 0) {
        return iVar4;
      }
LAB_001c0698:
      fts3SegReaderSort(pMsr->apSegment,nSegment,(int)lVar6,local_38);
      iVar4 = local_5c;
      if ((0 < local_5c) && ((*ppFVar1)->ppNextElem != (Fts3HashElem **)0x0)) {
        iVar5 = fts3MsrBufferData(pMsr,local_58,local_5c + 1);
        if (iVar5 != 0) {
          return iVar5;
        }
        local_58 = pMsr->aBuffer;
      }
      if (-1 < pMsr->iColFilter) {
        fts3ColumnFilter(pMsr->iColFilter,1,&local_58,&local_5c);
        iVar4 = local_5c;
      }
      if (0 < iVar4) {
        *local_50 = local_58;
        *local_48 = lVar3;
        *local_40 = iVar4;
        return 0;
      }
      pcVar2 = (*pMsr->apSegment)->pOffsetList;
    }
    *local_50 = (char *)0x0;
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3MsrIncrNext(
  Fts3Table *p,                   /* Virtual table handle */
  Fts3MultiSegReader *pMsr,       /* Multi-segment-reader handle */
  sqlite3_int64 *piDocid,         /* OUT: Docid value */
  char **paPoslist,               /* OUT: Pointer to position list */
  int *pnPoslist                  /* OUT: Size of position list in bytes */
){
  int nMerge = pMsr->nAdvance;
  Fts3SegReader **apSegment = pMsr->apSegment;
  int (*xCmp)(Fts3SegReader *, Fts3SegReader *) = (
    p->bDescIdx ? fts3SegReaderDoclistCmpRev : fts3SegReaderDoclistCmp
  );

  if( nMerge==0 ){
    *paPoslist = 0;
    return SQLITE_OK;
  }

  while( 1 ){
    Fts3SegReader *pSeg;
    pSeg = pMsr->apSegment[0];

    if( pSeg->pOffsetList==0 ){
      *paPoslist = 0;
      break;
    }else{
      int rc;
      char *pList;
      int nList;
      int j;
      sqlite3_int64 iDocid = apSegment[0]->iDocid;

      rc = fts3SegReaderNextDocid(p, apSegment[0], &pList, &nList);
      j = 1;
      while( rc==SQLITE_OK 
        && j<nMerge
        && apSegment[j]->pOffsetList
        && apSegment[j]->iDocid==iDocid
      ){
        rc = fts3SegReaderNextDocid(p, apSegment[j], 0, 0);
        j++;
      }
      if( rc!=SQLITE_OK ) return rc;
      fts3SegReaderSort(pMsr->apSegment, nMerge, j, xCmp);

      if( nList>0 && fts3SegReaderIsPending(apSegment[0]) ){
        rc = fts3MsrBufferData(pMsr, pList, nList+1);
        if( rc!=SQLITE_OK ) return rc;
        assert( (pMsr->aBuffer[nList] & 0xFE)==0x00 );
        pList = pMsr->aBuffer;
      }

      if( pMsr->iColFilter>=0 ){
        fts3ColumnFilter(pMsr->iColFilter, 1, &pList, &nList);
      }

      if( nList>0 ){
        *paPoslist = pList;
        *piDocid = iDocid;
        *pnPoslist = nList;
        break;
      }
    }
  }

  return SQLITE_OK;
}